

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<false,false,false,true>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  SVOBitset *other;
  Proof *pPVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  SVOBitset *pSVar6;
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  conditional_t<true,_SVOBitset,_tuple<>_> before;
  
  bVar2 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  other = &d->values;
  before.n_words = 0;
  SVOBitset::operator=(&before,other);
  if ((bVar2 & 1) != 0) {
    pSVar6 = HomomorphismModel::target_graph_row(this->model,0,current_assignment->target_vertex);
    SVOBitset::operator&=(other,pSVar6);
  }
  uVar3 = SVOBitset::count(&before);
  uVar4 = SVOBitset::count(other);
  if (uVar3 != uVar4) {
    pPVar1 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)local_108,this->model,current_assignment->pattern_vertex);
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              ((NamedVertex *)local_130,this->model,current_assignment->target_vertex);
    uVar3 = SVOBitset::count(&before);
    uVar4 = SVOBitset::count(other);
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_e0,this->model,d->v)
    ;
    Proof::propagated(pPVar1,(NamedVertex *)local_108,(NamedVertex *)local_130,0,uVar3 - uVar4,
                      (NamedVertex *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)(local_130 + 8));
    std::__cxx11::string::~string((string *)(local_108 + 8));
  }
  SVOBitset::operator=(&before,other);
  uVar3 = 1;
  while( true ) {
    if (this->model->max_graphs <= uVar3) break;
    if ((bVar2 >> (uVar3 & 0x1f) & 1) != 0) {
      pSVar6 = HomomorphismModel::target_graph_row
                         (this->model,uVar3,current_assignment->target_vertex);
      SVOBitset::operator&=(other,pSVar6);
    }
    uVar4 = SVOBitset::count(&before);
    uVar5 = SVOBitset::count(other);
    if (uVar4 != uVar5) {
      pPVar1 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_108,this->model,current_assignment->pattern_vertex);
      HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_130,this->model,current_assignment->target_vertex);
      uVar4 = SVOBitset::count(&before);
      uVar5 = SVOBitset::count(other);
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_e0,this->model,d->v);
      Proof::propagated(pPVar1,(NamedVertex *)local_108,(NamedVertex *)local_130,uVar3,uVar4 - uVar5
                        ,(NamedVertex *)local_e0);
      std::__cxx11::string::~string((string *)(local_e0 + 8));
      std::__cxx11::string::~string((string *)(local_130 + 8));
      std::__cxx11::string::~string((string *)(local_108 + 8));
    }
    SVOBitset::operator=(&before,other);
    uVar3 = uVar3 + 1;
  }
  SVOBitset::~SVOBitset(&before);
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}